

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learning.h
# Opt level: O2

int __thiscall
klogic::learning::
teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
::hits<klogic::learning::single_discrete_match<3>>
          (teacher<klogic::mvn,klogic::learning::sample<std::complex<double>>,klogic::learning::learn_error<std::complex<double>>>
           *this,single_discrete_match<3> *match)

{
  bool bVar1;
  int iVar2;
  pointer *X;
  cmplx local_38;
  
  iVar2 = 0;
  for (X = *(pointer **)this; (cvector *)X != *(cvector **)(this + 8); X = X + 5) {
    mvn::output(*(mvn **)(this + 0x18),(cvector *)X);
    bVar1 = single_discrete_match<3>::operator()(match,&local_38,(cmplx *)(X + 3));
    iVar2 = iVar2 + (uint)bVar1;
  }
  return iVar2;
}

Assistant:

int hits(Match const &match = Match()) const {
                int count = 0;

                for (typename std::vector<Sample>::const_iterator i = _samples.begin();
                        i != _samples.end(); ++i) {

                    if (match(learner.output(i->input), i->desired))
                        ++count;
                }

                return count;
            }